

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InThread.cpp
# Opt level: O0

void __thiscall Thread::run(Thread *this)

{
  int a;
  Element *pEVar1;
  QString local_398;
  QString local_380;
  QSize local_368;
  QColor local_360;
  QString local_350;
  TextElement local_338 [24];
  QString local_320;
  TextElement local_308 [28];
  QColor local_2ec;
  QLatin1Char local_2db;
  QChar local_2da;
  QArrayDataPointer<char16_t> local_2d8;
  QString local_2c0;
  QString local_2a8;
  HtmlElement local_290 [28];
  int local_274;
  undefined1 local_270 [4];
  int i;
  AutoTableElement local_260 [8];
  AutoTableElement tableElement;
  undefined1 local_240 [8];
  HelloWorldTableModel tableModel;
  QString local_220;
  QString local_208;
  QString local_1f0;
  QString local_1d8;
  QString local_1c0;
  TextElement local_1a8 [8];
  TextElement textElement;
  QColor local_190;
  QString local_180;
  TextElement local_168 [8];
  TextElement titleElement;
  QFlags<KDReports::HeaderLocation> local_14c;
  QString local_148;
  QImage local_130 [24];
  ImageElement local_118 [8];
  ImageElement imageElement;
  QArrayDataPointer<char16_t> local_100;
  QString local_e8;
  QFont local_d0 [16];
  QColor local_c0;
  QString local_b0;
  QString local_88;
  QImage local_70 [24];
  undefined1 local_58 [8];
  Report report;
  Thread *this_local;
  char16_t *str;
  char16_t *str_1;
  
  KDReports::Report::Report((Report *)local_58,(QObject *)0x0);
  QString::QString(&local_88,":/background.jpg");
  QImage::QImage(local_70,&local_88,(char *)0x0);
  KDReports::Report::setWatermarkImage((QImage *)local_58);
  QImage::~QImage(local_70);
  QString::~QString(&local_88);
  QString::QString(&local_b0);
  QColor::QColor(&local_c0,0xcc,0xcc,0xcc,0xff);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_100,(Data *)0x0,L"Helvetica",9);
  QString::QString(&local_e8,&local_100);
  QFont::QFont(local_d0,&local_e8,0x30,-1,false);
  KDReports::Report::setWatermarkText
            ((QString *)local_58,(int)&local_b0,(QColor *)0x0,(QFont *)&local_c0);
  QFont::~QFont(local_d0);
  QString::~QString(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
  QString::~QString(&local_b0);
  QString::QString(&local_148,":/logo.png");
  QImage::QImage(local_130,&local_148,(char *)0x0);
  KDReports::ImageElement::ImageElement(local_118,local_130);
  QImage::~QImage(local_130);
  QString::~QString(&local_148);
  QFlags<KDReports::HeaderLocation>::QFlags(&local_14c,AllPages);
  pEVar1 = (Element *)KDReports::Report::header((QFlags *)local_58);
  KDReports::Header::addElement(pEVar1,(AlignmentFlag)local_118);
  QObject::tr(&local_180,"KD Reports Hello world example",(char *)0x0,-1);
  KDReports::TextElement::TextElement(local_168,&local_180);
  QString::~QString(&local_180);
  KDReports::TextElement::setPointSize(18.0);
  QColor::QColor(&local_190);
  KDReports::Report::addElement((Element *)local_58,(AlignmentFlag)local_168,(QColor *)0x4);
  KDReports::Report::addVerticalSpacing(10.0);
  QString::QString(&local_1c0);
  KDReports::TextElement::TextElement(local_1a8,&local_1c0);
  QString::~QString(&local_1c0);
  QObject::tr(&local_1d8,"This is a sample report produced with KD Reports.",(char *)0x0,-1);
  KDReports::TextElement::operator<<(local_1a8,&local_1d8);
  QString::~QString(&local_1d8);
  QString::QString(&local_1f0,"\n");
  KDReports::TextElement::operator<<(local_1a8,&local_1f0);
  QString::~QString(&local_1f0);
  QObject::tr(&local_208,anon_var_dwarf_1207f,(char *)0x0,-1);
  KDReports::TextElement::operator<<(local_1a8,&local_208);
  QString::~QString(&local_208);
  QString::QString(&local_220,"\n");
  KDReports::TextElement::operator<<(local_1a8,&local_220);
  QString::~QString(&local_220);
  QColor::QColor((QColor *)&tableModel.field_0x8);
  KDReports::Report::addElement((Element *)local_58,(AlignmentFlag)local_1a8,(QColor *)0x1);
  HelloWorldTableModel::HelloWorldTableModel((HelloWorldTableModel *)local_240);
  KDReports::Report::addVerticalSpacing(10.0);
  KDReports::AutoTableElement::AutoTableElement(local_260,(QAbstractItemModel *)local_240);
  KDReports::AbstractTableElement::setBorder(1.0);
  QColor::QColor((QColor *)local_270);
  KDReports::Report::addElement((Element *)local_58,(AlignmentFlag)local_260,(QColor *)0x1);
  for (local_274 = 1; local_274 < 100; local_274 = local_274 + 1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_2d8,(Data *)0x0,L"<b>Customer</b> <em>%1</em>",0x1b);
    QString::QString(&local_2c0,&local_2d8);
    a = local_274;
    QLatin1Char::QLatin1Char(&local_2db,' ');
    QChar::QChar(&local_2da,local_2db);
    QString::arg(&local_2a8,&local_2c0,a,0,10,local_2da);
    KDReports::HtmlElement::HtmlElement(local_290,&local_2a8);
    QColor::QColor(&local_2ec);
    KDReports::Report::addElement((Element *)local_58,(AlignmentFlag)local_290,(QColor *)0x1);
    KDReports::HtmlElement::~HtmlElement(local_290);
    QString::~QString(&local_2a8);
    QString::~QString(&local_2c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
    QString::QString(&local_320,"  - 2006");
    KDReports::TextElement::TextElement(local_308,&local_320);
    KDReports::Report::addInlineElement((Element *)local_58);
    KDReports::TextElement::~TextElement(local_308);
    QString::~QString(&local_320);
  }
  KDReports::Report::addPageBreak();
  QString::QString(&local_350,"This is the last page");
  KDReports::TextElement::TextElement(local_338,&local_350);
  QColor::QColor(&local_360);
  KDReports::Report::addElement((Element *)local_58,(AlignmentFlag)local_338,(QColor *)0x1);
  KDReports::TextElement::~TextElement(local_338);
  QString::~QString(&local_350);
  QSize::QSize(&local_368,200,0x4b0);
  QString::QString(&local_380,"output.png");
  KDReports::Report::exportToImage((QSize)local_58,(QString *)local_368,(char *)&local_380);
  QString::~QString(&local_380);
  QString::QString(&local_398,"output.pdf");
  KDReports::Report::exportToFile((QString *)local_58,(QWidget *)&local_398);
  QString::~QString(&local_398);
  KDReports::AutoTableElement::~AutoTableElement(local_260);
  HelloWorldTableModel::~HelloWorldTableModel((HelloWorldTableModel *)local_240);
  KDReports::TextElement::~TextElement(local_1a8);
  KDReports::TextElement::~TextElement(local_168);
  KDReports::ImageElement::~ImageElement(local_118);
  KDReports::Report::~Report((Report *)local_58);
  return;
}

Assistant:

void run() override
    {

        // Create a report
        KDReports::Report report;

        report.setWatermarkImage(QImage(":/background.jpg"));
        report.setWatermarkText(QString());

        KDReports::ImageElement imageElement(QImage(":/logo.png"));
        report.header().addElement(imageElement);

        // Add a text element for the title
        KDReports::TextElement titleElement(QObject::tr("KD Reports Hello world example"));
        titleElement.setPointSize(18);
        report.addElement(titleElement, Qt::AlignHCenter);

        // A bit of spacing (10 mm)
        report.addVerticalSpacing(10);

        // Add another text element, demonstrating "<<" operator
        KDReports::TextElement textElement;
        textElement << QObject::tr("This is a sample report produced with KD Reports.");
        textElement << "\n";
        textElement << QObject::tr("Klarälvdalens Datakonsult AB, Platform-independent software solutions");
        textElement << "\n";
        report.addElement(textElement);

        // Create a table model, which will be used by the table element
        HelloWorldTableModel tableModel;

        // A bit of spacing (10 mm)
        report.addVerticalSpacing(10);

        // Add an "auto table" (a table that shows the contents of a model)
        KDReports::AutoTableElement tableElement(&tableModel);
        tableElement.setBorder(1);
        report.addElement(tableElement);

        // Add many paragraphs, to demonstrate page breaking
        for (int i = 1; i < 100; ++i) {
            report.addElement(KDReports::HtmlElement(QStringLiteral("<b>Customer</b> <em>%1</em>").arg(i)), Qt::AlignLeft);
            report.addInlineElement(KDReports::TextElement("  - 2006"));
        }

        // Add a page break
        report.addPageBreak();

        report.addElement(KDReports::TextElement("This is the last page"));

        // To export to an image file:
        // qDebug() << "Exporting to output.png";
        report.exportToImage(QSize(200, 1200), "output.png", "PNG"); // deleted by main() below

        // To export to a PDF file:
        // qDebug() << "Exporting to output.pdf";
        report.exportToFile("output.pdf"); // deleted by main() below
    }